

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

pattern * limitItem(void)

{
  pattern *lhs;
  pattern *rhs;
  
  lhs = featureItem();
  while (lookahead == 0x2c) {
    matchTok(0x2c);
    rhs = featureItem();
    lhs = makeNode(lhs,rhs,300);
  }
  return lhs;
}

Assistant:

pattern* limitItem() {
   pattern *lhs, *rhs;
   
   lhs = featureItem();
   for (;;) {
      if (lookahead == ',') {
	 matchTok(',');
	 rhs = featureItem();
	 lhs = makeNode(lhs, rhs, OR_NODE);
      }
      else {
	 break;
      }
   }
   return lhs;
}